

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention.cpp
# Opt level: O0

int __thiscall
ncnn::MultiHeadAttention::forward
          (MultiHeadAttention *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  size_type sVar1;
  float *pfVar2;
  long in_RCX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  float fVar3;
  int k_5;
  float sum_6;
  float *kptr_4;
  float *ptr_4;
  int j_9;
  float *outptr_6;
  int i_7;
  int k_4;
  float sum_5;
  float *vptr;
  float *qkptr;
  int j_8;
  float *outptr_5;
  int i_6;
  Mat xvm;
  Mat xqkm;
  int j_7;
  int j_6;
  float sum_4;
  int j_5;
  float max;
  float *ptr_3;
  int i_5;
  Mat outm_5;
  int j_4;
  float *outptr_4;
  float *mptr;
  int i_4;
  Mat outm_4;
  Mat *maskm;
  int k_3;
  float sum_3;
  float *kptr_3;
  float *qptr;
  int j_3;
  float *outptr_3;
  int i_3;
  Mat outm_3;
  Mat xkm;
  Mat xqm;
  float *outptr_2;
  int k_2;
  float sum_2;
  float *kptr_2;
  float *ptr_2;
  int j_2;
  int i_2;
  Mat outm_2;
  int k_1;
  float sum_1;
  float *kptr_1;
  float *ptr_1;
  int j_1;
  float *outptr_1;
  int i_1;
  Mat outm_1;
  int k;
  float sum;
  float *kptr;
  float *ptr;
  int j;
  float *outptr;
  int i;
  Mat outm;
  int q;
  float inv_sqrt_embed_dim_per_head;
  Mat xqkv;
  Mat xqk;
  Mat xv;
  Mat xk;
  Mat xq;
  Mat *top_blob;
  int embed_dim_per_head;
  int dst_seqlen;
  int src_seqlen;
  Mat *attn_mask_blob;
  Mat *v_blob;
  Mat *k_blob;
  Mat *q_blob;
  Mat *m_12;
  Mat *m_11;
  Mat *m_10;
  Mat *m_9;
  Mat *m_8;
  Mat *m_7;
  Mat *m_5;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  Mat *m_6;
  Allocator *in_stack_ffffffffffffe7a8;
  Allocator *in_stack_ffffffffffffe7b0;
  int in_stack_ffffffffffffe7b8;
  int in_stack_ffffffffffffe7bc;
  undefined4 in_stack_ffffffffffffe7c0;
  int in_stack_ffffffffffffe7c4;
  int in_stack_ffffffffffffe7c8;
  int in_stack_ffffffffffffe7cc;
  Mat *in_stack_ffffffffffffe7d0;
  void **ppvVar4;
  bool local_1541;
  const_reference local_1520;
  const_reference local_1518;
  const_reference local_1510;
  int local_1500;
  float local_14fc;
  float *local_14f8;
  undefined8 local_14f0;
  undefined8 local_14e8;
  undefined8 local_14e0;
  undefined4 local_14d8;
  long *local_14d0;
  undefined4 local_14c8;
  undefined4 local_14c4;
  undefined4 local_14c0;
  undefined4 local_14bc;
  undefined4 local_14b8;
  undefined8 local_14b0;
  float *local_14a8;
  int local_149c;
  void *local_1498;
  int local_148c;
  int local_1488;
  float local_1484;
  float *local_1480;
  float *local_1478;
  int local_146c;
  undefined8 local_1468;
  undefined8 local_1460;
  undefined8 local_1458;
  undefined4 local_1450;
  long *local_1448;
  undefined4 local_1440;
  undefined4 local_143c;
  undefined4 local_1438;
  undefined4 local_1434;
  undefined4 local_1430;
  undefined8 local_1428;
  void *local_1420;
  int local_1414;
  undefined8 local_1410;
  undefined8 local_1408;
  undefined8 local_1400;
  undefined4 local_13f8;
  long *local_13f0;
  undefined4 local_13e8;
  undefined4 local_13e4;
  undefined4 local_13e0;
  undefined4 local_13dc;
  undefined4 local_13d8;
  undefined8 local_13d0;
  undefined8 local_13c8;
  undefined8 local_13c0;
  undefined8 local_13b8;
  undefined4 local_13b0;
  long *local_13a8;
  undefined4 local_13a0;
  undefined4 local_139c;
  undefined4 local_1398;
  undefined4 local_1394;
  undefined4 local_1390;
  undefined8 local_1388;
  int local_137c;
  int local_1378;
  float local_1374;
  int local_1370;
  float local_136c;
  void *local_1368;
  int local_135c;
  void *local_1358;
  int *local_1350;
  ulong local_1348;
  undefined4 local_1340;
  long *local_1338;
  int local_1330;
  int local_132c;
  int local_1328;
  undefined4 local_1324;
  undefined4 local_1320;
  ulong local_1318;
  int local_130c;
  void *local_1308;
  void *local_1300;
  int local_12f4;
  undefined8 local_12f0;
  undefined8 local_12e8;
  undefined8 local_12e0;
  undefined4 local_12d8;
  long *local_12d0;
  undefined4 local_12c8;
  undefined4 local_12c4;
  undefined4 local_12c0;
  undefined4 local_12bc;
  undefined4 local_12b8;
  undefined8 local_12b0;
  void *local_12a8;
  int *local_12a0;
  void *local_1298;
  undefined4 local_1290;
  long *local_1288;
  int local_1280;
  int local_127c;
  int local_1278;
  undefined4 local_1274;
  undefined4 local_1270;
  void *local_1268;
  void **local_1260;
  int local_1258;
  float local_1254;
  float *local_1250;
  float *local_1248;
  int local_123c;
  void *local_1238;
  int local_122c;
  undefined8 local_1228;
  undefined8 local_1220;
  undefined8 local_1218;
  undefined4 local_1210;
  long *local_1208;
  undefined4 local_1200;
  undefined4 local_11fc;
  undefined4 local_11f8;
  undefined4 local_11f4;
  undefined4 local_11f0;
  undefined8 local_11e8;
  undefined8 local_11e0;
  undefined8 local_11d8;
  undefined8 local_11d0;
  undefined4 local_11c8;
  long *local_11c0;
  undefined4 local_11b8;
  undefined4 local_11b4;
  undefined4 local_11b0;
  undefined4 local_11ac;
  undefined4 local_11a8;
  undefined8 local_11a0;
  undefined8 local_1198;
  undefined8 local_1190;
  undefined8 local_1188;
  undefined4 local_1180;
  long *local_1178;
  undefined4 local_1170;
  undefined4 local_116c;
  undefined4 local_1168;
  undefined4 local_1164;
  undefined4 local_1160;
  undefined8 local_1158;
  void *local_1150;
  int local_1148;
  float local_1144;
  float *local_1140;
  float *local_1138;
  int local_1130;
  int local_112c;
  undefined8 local_1128;
  undefined8 local_1120;
  undefined8 local_1118;
  undefined4 local_1110;
  long *local_1108;
  undefined4 local_1100;
  undefined4 local_10fc;
  undefined4 local_10f8;
  undefined4 local_10f4;
  undefined4 local_10f0;
  undefined8 local_10e8;
  int local_10e0;
  float local_10dc;
  float *local_10d8;
  float *local_10d0;
  int local_10c4;
  void *local_10c0;
  int local_10b4;
  undefined8 local_10b0;
  undefined8 local_10a8;
  undefined8 local_10a0;
  undefined4 local_1098;
  long *local_1090;
  undefined4 local_1088;
  undefined4 local_1084;
  undefined4 local_1080;
  undefined4 local_107c;
  undefined4 local_1078;
  undefined8 local_1070;
  int local_1068;
  float local_1064;
  float *local_1060;
  float *local_1058;
  int local_104c;
  void *local_1048;
  int local_103c;
  undefined8 local_1038;
  undefined8 local_1030;
  undefined8 local_1028;
  undefined4 local_1020;
  long *local_1018;
  undefined4 local_1010;
  undefined4 local_100c;
  undefined4 local_1008;
  undefined4 local_1004;
  undefined4 local_1000;
  undefined8 local_ff8;
  int local_ff0;
  float local_fec;
  void *local_fe8;
  int *local_fe0;
  long local_fd8;
  undefined4 local_fd0;
  long *local_fc8;
  undefined4 local_fc0;
  int local_fbc;
  int local_fb8;
  undefined4 local_fb4;
  undefined4 local_fb0;
  long local_fa8;
  void *local_fa0;
  int *local_f98;
  ulong local_f90;
  undefined4 local_f88;
  long *local_f80;
  int local_f78;
  int local_f74;
  int local_f70;
  undefined4 local_f6c;
  undefined4 local_f68;
  long local_f60;
  void *local_f58;
  int *local_f50;
  long local_f48;
  undefined4 local_f40;
  long *local_f38;
  undefined4 local_f30;
  int local_f2c;
  int local_f28;
  undefined4 local_f24;
  undefined4 local_f20;
  long local_f18;
  void *local_f10;
  int *local_f08;
  long local_f00;
  undefined4 local_ef8;
  long *local_ef0;
  undefined4 local_ee8;
  int local_ee4;
  int local_ee0;
  undefined4 local_edc;
  undefined4 local_ed8;
  long local_ed0;
  void *local_ec8;
  int *local_ec0;
  long local_eb8;
  undefined4 local_eb0;
  long *local_ea8;
  undefined4 local_ea0;
  int local_e9c;
  int local_e98;
  undefined4 local_e94;
  undefined4 local_e90;
  long local_e88;
  undefined4 local_e80;
  reference local_e70;
  int local_e64;
  int local_e60;
  int local_e5c;
  void *local_e58;
  int *local_e50;
  size_t local_e48;
  int local_e40;
  Allocator *local_e38;
  int local_e30;
  int local_e2c;
  int local_e28;
  int local_e24;
  int local_e20;
  size_t local_e18;
  void **local_e10;
  const_reference local_e08;
  const_reference local_e00;
  const_reference local_df8;
  long local_df0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_de8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_de0;
  int local_dcc;
  void **local_dc8;
  undefined8 *local_dc0;
  undefined8 *local_db0;
  undefined8 *local_da0;
  undefined8 *local_d90;
  undefined8 *local_d80;
  undefined8 *local_d70;
  undefined8 *local_d60;
  void **local_d50;
  void **local_d40;
  undefined8 *local_d30;
  undefined8 *local_d20;
  undefined8 *local_d10;
  undefined8 *local_d00;
  void **local_cf0;
  void **local_ce0;
  void **local_cd0;
  void **local_cc0;
  void **local_cb0;
  void **local_ca0;
  reference local_c90;
  const_reference local_c88;
  void **local_c80;
  void **local_c78;
  void **local_c70;
  undefined8 local_c68;
  undefined8 local_c60;
  undefined4 local_c54;
  int local_c50;
  int local_c4c;
  void **local_c48;
  undefined8 local_c40;
  undefined8 local_c38;
  undefined4 local_c2c;
  int local_c28;
  int local_c24;
  void **local_c20;
  undefined8 local_c18;
  undefined8 local_c10;
  undefined4 local_c04;
  int local_c00;
  int local_bfc;
  void **local_bf8;
  undefined8 local_bf0;
  undefined8 local_be8;
  undefined4 local_bdc;
  int local_bd8;
  int local_bd4;
  void **local_bd0;
  undefined8 local_bc8;
  undefined8 local_bc0;
  int local_bb4;
  undefined4 local_bb0;
  int local_bac;
  void **local_ba8;
  undefined1 local_b9d;
  int local_b9c;
  void **local_b98;
  undefined8 *local_b90;
  undefined1 local_b7d;
  int local_b7c;
  void **local_b78;
  undefined8 *local_b70;
  undefined1 local_b5d;
  int local_b5c;
  void **local_b58;
  undefined8 *local_b50;
  undefined1 local_b3d;
  int local_b3c;
  void **local_b38;
  undefined8 *local_b30;
  undefined1 local_b1d;
  int local_b1c;
  void **local_b18;
  void **local_b10;
  undefined1 local_afd;
  int local_afc;
  void **local_af8;
  undefined8 *local_af0;
  undefined1 local_add;
  int local_adc;
  void **local_ad8;
  undefined8 *local_ad0;
  undefined1 local_abd;
  int local_abc;
  void **local_ab8;
  undefined8 *local_ab0;
  undefined1 local_a9d;
  int local_a9c;
  void **local_a98;
  undefined8 *local_a90;
  undefined1 local_a7d;
  int local_a7c;
  void **local_a78;
  undefined8 *local_a70;
  undefined1 local_a5d;
  int local_a5c;
  void **local_a58;
  undefined8 *local_a50;
  undefined1 local_a3d;
  int local_a3c;
  void **local_a38;
  undefined8 *local_a30;
  int local_a1c;
  reference local_a18;
  int local_a0c;
  undefined8 *local_a08;
  int local_9fc;
  void **local_9f8;
  int local_9ec;
  undefined8 *local_9e8;
  int local_9dc;
  undefined8 *local_9d8;
  int local_9cc;
  undefined8 *local_9c8;
  int local_9bc;
  undefined8 *local_9b8;
  int local_9ac;
  undefined8 *local_9a8;
  int local_99c;
  undefined8 *local_998;
  int local_98c;
  undefined8 *local_988;
  int local_97c;
  void **local_978;
  int local_96c;
  undefined8 *local_968;
  int local_95c;
  undefined8 *local_958;
  int local_94c;
  const_reference local_948;
  int local_93c;
  const_reference local_938;
  int local_92c;
  const_reference local_928;
  long *local_920;
  long *local_918;
  long *local_910;
  long *local_908;
  long local_900;
  long *local_8f8;
  long local_8f0;
  long *local_8e8;
  long local_8e0;
  long *local_8d8;
  long local_8d0;
  long *local_8c8;
  undefined1 local_8bd;
  int local_8bc;
  void **local_8b8;
  void **local_8b0;
  undefined8 *local_8a0;
  int local_7b8;
  undefined4 local_7b4;
  void **local_7b0;
  int local_798;
  undefined4 local_794;
  void **local_790;
  int local_778;
  undefined4 local_774;
  void **local_770;
  int local_758;
  undefined4 local_754;
  void **local_750;
  int local_738;
  undefined4 local_734;
  void **local_730;
  int local_718;
  undefined4 local_714;
  void **local_710;
  undefined8 *local_6f0;
  undefined8 *local_6d0;
  undefined8 *local_6b0;
  undefined8 *local_690;
  int local_678;
  undefined4 local_674;
  void **local_670;
  int local_658;
  undefined4 local_654;
  void **local_650;
  undefined8 *local_630;
  undefined8 *local_610;
  undefined8 *local_5f0;
  undefined8 *local_5d0;
  undefined8 *local_5b0;
  undefined8 *local_590;
  undefined8 *local_570;
  void *local_4f8;
  void *local_4e8;
  void *local_498;
  void *local_488;
  void *local_478;
  void *local_468;
  void *local_458;
  void *local_448;
  reference local_3d0;
  int local_3c8;
  undefined4 local_3c4;
  void **local_3c0;
  int local_3b8;
  undefined4 local_3b4;
  void **local_3b0;
  long *local_3a8;
  undefined4 local_39c;
  void *local_398;
  void *local_390;
  undefined4 local_384;
  int local_380;
  int local_37c;
  void **local_378;
  long *local_370;
  undefined4 local_364;
  long local_360;
  void *local_358;
  undefined4 local_34c;
  int local_348;
  int local_344;
  undefined8 *local_340;
  long *local_338;
  undefined4 local_32c;
  long local_328;
  void *local_320;
  undefined4 local_314;
  int local_310;
  int local_30c;
  undefined8 *local_308;
  long *local_300;
  undefined4 local_2f4;
  long local_2f0;
  void *local_2e8;
  undefined4 local_2dc;
  int local_2d8;
  int local_2d4;
  undefined8 *local_2d0;
  long *local_2c8;
  undefined4 local_2bc;
  long local_2b8;
  void *local_2b0;
  undefined4 local_2a4;
  int local_2a0;
  int local_29c;
  undefined8 *local_298;
  long *local_290;
  undefined4 local_284;
  long local_280;
  void *local_278;
  undefined4 local_26c;
  int local_268;
  int local_264;
  undefined8 *local_260;
  long *local_258;
  undefined4 local_24c;
  ulong local_248;
  void *local_240;
  undefined4 local_234;
  int local_230;
  int local_22c;
  undefined8 *local_228;
  long *local_220;
  undefined4 local_214;
  ulong local_210;
  void *local_208;
  undefined4 local_1fc;
  int local_1f8;
  int local_1f4;
  undefined8 *local_1f0;
  long *local_1e8;
  undefined4 local_1dc;
  ulong local_1d8;
  void *local_1d0;
  undefined4 local_1c4;
  int local_1c0;
  int local_1bc;
  void **local_1b8;
  long *local_1b0;
  undefined4 local_1a4;
  ulong local_1a0;
  void *local_198;
  undefined4 local_18c;
  int local_188;
  int local_184;
  undefined8 *local_180;
  long *local_178;
  undefined4 local_16c;
  long local_168;
  void *local_160;
  undefined4 local_154;
  int local_150;
  int local_14c;
  undefined8 *local_148;
  long *local_140;
  undefined4 local_134;
  long local_130;
  void *local_128;
  undefined4 local_11c;
  int local_118;
  int local_114;
  undefined8 *local_110;
  long *local_108;
  undefined4 local_fc;
  long local_f8;
  float *local_f0;
  undefined4 local_e4;
  int local_e0;
  int local_dc;
  undefined8 *local_d8;
  undefined4 local_cc;
  long local_c8;
  undefined4 local_bc;
  long local_b8;
  undefined4 local_ac;
  long local_a8;
  undefined4 local_9c;
  long local_98;
  undefined4 local_8c;
  long local_88;
  undefined4 local_7c;
  long local_78;
  undefined4 local_6c;
  long local_68;
  undefined4 local_5c;
  long local_58;
  undefined4 local_4c;
  long local_48;
  undefined4 local_3c;
  long local_38;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  local_df0 = in_RCX;
  local_de8 = in_RDX;
  local_de0 = in_RSI;
  local_df8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  sVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_de0);
  if ((sVar1 == 1) ||
     ((sVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_de0), sVar1 == 2 &&
      (*(int *)(in_RDI + 0xe4) != 0)))) {
    local_1510 = local_df8;
  }
  else {
    local_1510 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_de0,1);
  }
  local_e00 = local_1510;
  sVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_de0);
  if ((sVar1 == 1) ||
     ((sVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_de0), sVar1 == 2 &&
      (*(int *)(in_RDI + 0xe4) != 0)))) {
    local_1518 = local_df8;
  }
  else {
    sVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_de0);
    if ((sVar1 == 2) ||
       ((sVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_de0), sVar1 == 3 &&
        (*(int *)(in_RDI + 0xe4) != 0)))) {
      local_1520 = local_e00;
    }
    else {
      local_1520 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_de0,2);
    }
    local_1518 = local_1520;
  }
  local_e08 = local_1518;
  if (*(int *)(in_RDI + 0xe4) == 0) {
    local_dc8 = &local_e58;
    local_e58 = (void *)0x0;
    local_e50 = (int *)0x0;
    local_e48 = 0;
    local_e40 = 0;
    local_e38 = (Allocator *)0x0;
    local_e30 = 0;
    local_e2c = 0;
    local_e28 = 0;
    local_e24 = 0;
    local_e20 = 0;
    local_e18 = 0;
  }
  else {
    sVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_de0);
    local_c88 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_de0,sVar1 - 1);
    local_c80 = &local_e58;
    local_e58 = local_c88->data;
    local_e50 = local_c88->refcount;
    local_e48 = local_c88->elemsize;
    local_e40 = local_c88->elempack;
    local_e38 = local_c88->allocator;
    local_e30 = local_c88->dims;
    local_e2c = local_c88->w;
    local_e28 = local_c88->h;
    local_e24 = local_c88->d;
    local_e20 = local_c88->c;
    local_e18 = local_c88->cstep;
    local_3b0 = local_c80;
    if (local_e50 != (int *)0x0) {
      local_3b4 = 1;
      LOCK();
      local_3b8 = *local_e50;
      *local_e50 = *local_e50 + 1;
      UNLOCK();
    }
  }
  local_e10 = &local_e58;
  local_e5c = local_df8->h;
  local_e60 = local_e00->h;
  local_e64 = *(int *)(in_RDI + 0xd0) / *(int *)(in_RDI + 0xd4);
  local_e70 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_de8,0);
  Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffe7c4,in_stack_ffffffffffffe7c0),
              in_stack_ffffffffffffe7bc,in_stack_ffffffffffffe7b8,(size_t)in_stack_ffffffffffffe7b0,
              in_stack_ffffffffffffe7a8);
  local_c90 = local_e70;
  local_1541 = true;
  if (local_e70->data != (void *)0x0) {
    local_3d0 = local_e70;
    local_1541 = local_e70->cstep * (long)local_e70->c == 0;
  }
  if (local_1541) {
    local_dcc = -1;
    local_e80 = 1;
  }
  else {
    local_c54 = *(undefined4 *)(in_RDI + 0xd4);
    local_c68 = *(undefined8 *)(local_df0 + 0x10);
    local_c48 = &local_ec8;
    local_c4c = local_e64;
    local_c50 = local_e5c;
    local_c60 = 4;
    local_ec8 = (void *)0x0;
    local_ec0 = (int *)0x0;
    local_eb8 = 0;
    local_eb0 = 0;
    local_ea8 = (long *)0x0;
    local_ea0 = 0;
    local_e9c = 0;
    local_e98 = 0;
    local_e94 = 0;
    local_e90 = 0;
    local_e88 = 0;
    Mat::create(in_stack_ffffffffffffe7d0,in_stack_ffffffffffffe7cc,in_stack_ffffffffffffe7c8,
                in_stack_ffffffffffffe7c4,
                CONCAT44(in_stack_ffffffffffffe7bc,in_stack_ffffffffffffe7b8),
                in_stack_ffffffffffffe7b0);
    local_c2c = *(undefined4 *)(in_RDI + 0xd4);
    local_c40 = *(undefined8 *)(local_df0 + 0x10);
    local_c20 = &local_f10;
    local_c24 = local_e64;
    local_c28 = local_e60;
    local_c38 = 4;
    local_f10 = (void *)0x0;
    local_f08 = (int *)0x0;
    local_f00 = 0;
    local_ef8 = 0;
    local_ef0 = (long *)0x0;
    local_ee8 = 0;
    local_ee4 = 0;
    local_ee0 = 0;
    local_edc = 0;
    local_ed8 = 0;
    local_ed0 = 0;
    Mat::create(in_stack_ffffffffffffe7d0,in_stack_ffffffffffffe7cc,in_stack_ffffffffffffe7c8,
                in_stack_ffffffffffffe7c4,
                CONCAT44(in_stack_ffffffffffffe7bc,in_stack_ffffffffffffe7b8),
                in_stack_ffffffffffffe7b0);
    local_c04 = *(undefined4 *)(in_RDI + 0xd4);
    local_c18 = *(undefined8 *)(local_df0 + 0x10);
    local_bf8 = &local_f58;
    local_bfc = local_e60;
    local_c00 = local_e64;
    local_c10 = 4;
    local_f58 = (void *)0x0;
    local_f50 = (int *)0x0;
    local_f48 = 0;
    local_f40 = 0;
    local_f38 = (long *)0x0;
    local_f30 = 0;
    local_f2c = 0;
    local_f28 = 0;
    local_f24 = 0;
    local_f20 = 0;
    local_f18 = 0;
    Mat::create(in_stack_ffffffffffffe7d0,in_stack_ffffffffffffe7cc,in_stack_ffffffffffffe7c8,
                in_stack_ffffffffffffe7c4,
                CONCAT44(in_stack_ffffffffffffe7bc,in_stack_ffffffffffffe7b8),
                in_stack_ffffffffffffe7b0);
    local_bdc = *(undefined4 *)(in_RDI + 0xd4);
    local_bf0 = *(undefined8 *)(local_df0 + 0x10);
    local_bd0 = &local_fa0;
    local_bd4 = local_e60;
    local_bd8 = local_e5c;
    local_be8 = 4;
    local_fa0 = (void *)0x0;
    local_f98 = (int *)0x0;
    local_f90 = 0;
    local_f88 = 0;
    local_f80 = (long *)0x0;
    local_f78 = 0;
    local_f74 = 0;
    local_f70 = 0;
    local_f6c = 0;
    local_f68 = 0;
    local_f60 = 0;
    Mat::create(in_stack_ffffffffffffe7d0,in_stack_ffffffffffffe7cc,in_stack_ffffffffffffe7c8,
                in_stack_ffffffffffffe7c4,
                CONCAT44(in_stack_ffffffffffffe7bc,in_stack_ffffffffffffe7b8),
                in_stack_ffffffffffffe7b0);
    local_bb0 = *(undefined4 *)(in_RDI + 0xd4);
    local_bc8 = *(undefined8 *)(local_df0 + 0x10);
    local_ba8 = &local_fe8;
    local_bac = local_e64;
    local_bb4 = local_e5c;
    local_bc0 = 4;
    local_fe8 = (void *)0x0;
    local_fe0 = (int *)0x0;
    local_fd8 = 0;
    local_fd0 = 0;
    local_fc8 = (long *)0x0;
    local_fc0 = 0;
    local_fbc = 0;
    local_fb8 = 0;
    local_fb4 = 0;
    local_fb0 = 0;
    local_fa8 = 0;
    Mat::create(in_stack_ffffffffffffe7d0,in_stack_ffffffffffffe7cc,in_stack_ffffffffffffe7c8,
                in_stack_ffffffffffffe7c4,
                CONCAT44(in_stack_ffffffffffffe7bc,in_stack_ffffffffffffe7b8),
                in_stack_ffffffffffffe7b0);
    local_fec = 1.0 / SQRT((float)local_e64);
    for (local_ff0 = 0; local_ff0 < *(int *)(in_RDI + 0xd4); local_ff0 = local_ff0 + 1) {
      local_a30 = &local_1038;
      local_a38 = &local_ec8;
      local_358 = (void *)((long)local_ec8 + local_e88 * local_ff0 * local_eb8);
      local_340 = &local_1038;
      local_1018 = local_ea8;
      local_18 = (long)local_e9c * (long)local_e98 * local_eb8;
      for (local_103c = 0; local_103c < local_e5c; local_103c = local_103c + 1) {
        local_9ac = local_103c;
        local_9a8 = &local_1038;
        local_1048 = (void *)((long)local_358 + (long)local_e9c * (long)local_103c * local_eb8);
        for (local_104c = 0; local_104c < local_e64; local_104c = local_104c + 1) {
          local_928 = local_df8;
          local_92c = local_103c;
          local_908 = (long *)(in_RDI + 0xe8);
          local_8c8 = (long *)(in_RDI + 0x130);
          local_8d0 = (long)(local_ff0 * local_e64 + local_104c);
          local_1064 = *(float *)(*local_8c8 + local_8d0 * 4);
          local_1060 = (float *)(*local_908 +
                                (long)(*(int *)(in_RDI + 0xd0) *
                                      (local_ff0 * local_e64 + local_104c)) * 4);
          local_1058 = (float *)((long)local_df8->data +
                                (long)local_df8->w * (long)local_103c * local_df8->elemsize);
          for (local_1068 = 0; local_1068 < *(int *)(in_RDI + 0xd0); local_1068 = local_1068 + 1) {
            local_1064 = *local_1058 * *local_1060 + local_1064;
            local_1060 = local_1060 + 1;
            local_1058 = local_1058 + 1;
          }
          *(float *)((long)local_1048 + (long)local_104c * 4) = local_1064 * local_fec;
        }
      }
      local_dc0 = &local_1038;
      local_1038 = 0;
      local_1028 = 0;
      local_1020 = 0;
      local_100c = 0;
      local_1008 = 0;
      local_1004 = 0;
      local_1000 = 0;
      local_1030 = 0;
      local_a50 = &local_10b0;
      local_a58 = &local_f10;
      local_320 = (void *)((long)local_f10 + local_ed0 * local_ff0 * local_f00);
      local_308 = &local_10b0;
      local_1090 = local_ef0;
      local_28 = (long)local_ee4 * (long)local_ee0 * local_f00;
      for (local_10b4 = 0; local_10b4 < local_e60; local_10b4 = local_10b4 + 1) {
        local_9bc = local_10b4;
        local_9b8 = &local_10b0;
        local_10c0 = (void *)((long)local_320 + (long)local_ee4 * (long)local_10b4 * local_f00);
        for (local_10c4 = 0; local_10c4 < local_e64; local_10c4 = local_10c4 + 1) {
          local_938 = local_e00;
          local_93c = local_10b4;
          local_910 = (long *)(in_RDI + 0x178);
          local_8d8 = (long *)(in_RDI + 0x1c0);
          local_8e0 = (long)(local_ff0 * local_e64 + local_10c4);
          local_10dc = *(float *)(*local_8d8 + local_8e0 * 4);
          local_10d8 = (float *)(*local_910 +
                                (long)(*(int *)(in_RDI + 0xdc) *
                                      (local_ff0 * local_e64 + local_10c4)) * 4);
          local_10d0 = (float *)((long)local_e00->data +
                                (long)local_e00->w * (long)local_10b4 * local_e00->elemsize);
          for (local_10e0 = 0; local_10e0 < *(int *)(in_RDI + 0xdc); local_10e0 = local_10e0 + 1) {
            local_10dc = *local_10d0 * *local_10d8 + local_10dc;
            local_10d8 = local_10d8 + 1;
            local_10d0 = local_10d0 + 1;
          }
          *(float *)((long)local_10c0 + (long)local_10c4 * 4) = local_10dc;
        }
      }
      local_db0 = &local_10b0;
      local_10b0 = 0;
      local_10a0 = 0;
      local_1098 = 0;
      local_1084 = 0;
      local_1080 = 0;
      local_107c = 0;
      local_1078 = 0;
      local_10a8 = 0;
      local_a70 = &local_1128;
      local_a78 = &local_f58;
      local_2e8 = (void *)((long)local_f58 + local_f18 * local_ff0 * local_f48);
      local_2d0 = &local_1128;
      local_1108 = local_f38;
      local_38 = (long)local_f2c * (long)local_f28 * local_f48;
      for (local_112c = 0; local_112c < local_e64; local_112c = local_112c + 1) {
        for (local_1130 = 0; local_1130 < local_e60; local_1130 = local_1130 + 1) {
          local_948 = local_e08;
          local_94c = local_1130;
          local_918 = (long *)(in_RDI + 0x208);
          local_8e8 = (long *)(in_RDI + 0x250);
          local_8f0 = (long)(local_ff0 * local_e64 + local_112c);
          local_1144 = *(float *)(*local_8e8 + local_8f0 * 4);
          local_1140 = (float *)(*local_918 +
                                (long)(*(int *)(in_RDI + 0xe0) *
                                      (local_ff0 * local_e64 + local_112c)) * 4);
          local_1138 = (float *)((long)local_e08->data +
                                (long)local_e08->w * (long)local_1130 * local_e08->elemsize);
          for (local_1148 = 0; local_1148 < *(int *)(in_RDI + 0xe0); local_1148 = local_1148 + 1) {
            local_1144 = *local_1138 * *local_1140 + local_1144;
            local_1140 = local_1140 + 1;
            local_1138 = local_1138 + 1;
          }
          local_9cc = local_112c;
          local_9c8 = &local_1128;
          local_1150 = (void *)((long)local_2e8 + (long)local_f2c * (long)local_112c * local_f48);
          *(float *)((long)local_1150 + (long)local_1130 * 4) = local_1144;
        }
      }
      local_da0 = &local_1128;
      local_1128 = 0;
      local_1118 = 0;
      local_1110 = 0;
      local_10fc = 0;
      local_10f8 = 0;
      local_10f4 = 0;
      local_10f0 = 0;
      local_1120 = 0;
      local_a90 = &local_1198;
      local_a98 = &local_ec8;
      local_2b0 = (void *)((long)local_ec8 + local_e88 * local_ff0 * local_eb8);
      local_298 = &local_1198;
      local_1178 = local_ea8;
      local_48 = (long)local_e9c * (long)local_e98 * local_eb8;
      local_ab0 = &local_11e0;
      local_ab8 = &local_f10;
      local_278 = (void *)((long)local_f10 + local_ed0 * local_ff0 * local_f00);
      local_260 = &local_11e0;
      local_11c0 = local_ef0;
      local_58 = (long)local_ee4 * (long)local_ee0 * local_f00;
      local_ad0 = &local_1228;
      local_ad8 = &local_fa0;
      local_240 = (void *)((long)local_fa0 + local_f60 * local_ff0 * local_f90);
      local_228 = &local_1228;
      local_1208 = local_f80;
      local_68 = (long)local_f74 * (long)local_f70 * local_f90;
      for (local_122c = 0; local_122c < local_e5c; local_122c = local_122c + 1) {
        local_9dc = local_122c;
        local_9d8 = &local_1228;
        local_1238 = (void *)((long)local_240 + (long)local_f74 * (long)local_122c * local_f90);
        for (local_123c = 0; local_123c < local_e60; local_123c = local_123c + 1) {
          local_95c = local_122c;
          local_958 = &local_1198;
          local_96c = local_123c;
          local_968 = &local_11e0;
          local_1254 = 0.0;
          local_1250 = (float *)((long)local_278 + (long)local_ee4 * (long)local_123c * local_f00);
          local_1248 = (float *)((long)local_2b0 + (long)local_e9c * (long)local_122c * local_eb8);
          for (local_1258 = 0; local_1258 < local_e64; local_1258 = local_1258 + 1) {
            local_1254 = *local_1248 * *local_1250 + local_1254;
            local_1250 = local_1250 + 1;
            local_1248 = local_1248 + 1;
          }
          *(float *)((long)local_1238 + (long)local_123c * 4) = local_1254;
        }
      }
      local_d90 = &local_1228;
      local_1228 = 0;
      local_1218 = 0;
      local_1210 = 0;
      local_11fc = 0;
      local_11f8 = 0;
      local_11f4 = 0;
      local_11f0 = 0;
      local_1220 = 0;
      local_d80 = &local_11e0;
      local_11e0 = 0;
      local_11d0 = 0;
      local_11c8 = 0;
      local_11b4 = 0;
      local_11b0 = 0;
      local_11ac = 0;
      local_11a8 = 0;
      local_11d8 = 0;
      local_d70 = &local_1198;
      local_1000 = 0;
      local_1004 = 0;
      local_1008 = 0;
      local_100c = 0;
      local_1020 = 0;
      local_1028 = 0;
      local_1030 = 0;
      local_1038 = 0;
      local_1078 = 0;
      local_107c = 0;
      local_1080 = 0;
      local_1084 = 0;
      local_1098 = 0;
      local_10a0 = 0;
      local_10a8 = 0;
      local_10b0 = 0;
      local_10f0 = 0;
      local_10f4 = 0;
      local_10f8 = 0;
      local_10fc = 0;
      local_1110 = 0;
      local_1118 = 0;
      local_1120 = 0;
      local_1128 = 0;
      local_11a8 = 0;
      local_11ac = 0;
      local_11b0 = 0;
      local_11b4 = 0;
      local_11c8 = 0;
      local_11d0 = 0;
      local_11d8 = 0;
      local_11e0 = 0;
      local_11f0 = 0;
      local_11f4 = 0;
      local_11f8 = 0;
      local_11fc = 0;
      local_1210 = 0;
      local_1218 = 0;
      local_1220 = 0;
      local_1228 = 0;
      local_1c = 0x10;
      local_2c = 0x10;
      local_3c = 0x10;
      local_4c = 0x10;
      local_5c = 0x10;
      local_6c = 0x10;
      local_22c = local_f74;
      local_230 = local_f70;
      local_234 = local_f6c;
      local_248 = local_f90;
      local_24c = local_f88;
      local_258 = local_f80;
      local_264 = local_ee4;
      local_268 = local_ee0;
      local_26c = local_edc;
      local_280 = local_f00;
      local_284 = local_ef8;
      local_290 = local_ef0;
      local_29c = local_e9c;
      local_2a0 = local_e98;
      local_2a4 = local_e94;
      local_2b8 = local_eb8;
      local_2bc = local_eb0;
      local_2c8 = local_ea8;
      local_2d4 = local_f2c;
      local_2d8 = local_f28;
      local_2dc = local_f24;
      local_2f0 = local_f48;
      local_2f4 = local_f40;
      local_300 = local_f38;
      local_30c = local_ee4;
      local_310 = local_ee0;
      local_314 = local_edc;
      local_328 = local_f00;
      local_32c = local_ef8;
      local_338 = local_ef0;
      local_344 = local_e9c;
      local_348 = local_e98;
      local_34c = local_e94;
      local_360 = local_eb8;
      local_364 = local_eb0;
      local_370 = local_ea8;
      local_a3c = local_ff0;
      local_a3d = 1;
      local_a5c = local_ff0;
      local_a5d = 1;
      local_a7c = local_ff0;
      local_a7d = 1;
      local_a9c = local_ff0;
      local_a9d = 1;
      local_abc = local_ff0;
      local_abd = 1;
      local_adc = local_ff0;
      local_add = 1;
      local_ff8 = 0;
      local_1010 = 0;
      local_1070 = 0;
      local_1088 = 0;
      local_10e8 = 0;
      local_1100 = 0;
      local_11a0 = 0;
      local_11b8 = 0;
      local_11e8 = 0;
      local_1200 = 0;
      local_1198 = 0;
      local_1188 = 0;
      local_1180 = 0;
      local_1170 = 0;
      local_116c = 0;
      local_1168 = 0;
      local_1164 = 0;
      local_1160 = 0;
      local_1158 = 0;
      local_1190 = 0;
      local_610 = local_d70;
      local_5f0 = local_d80;
      local_5d0 = local_d90;
      local_5b0 = local_da0;
      local_590 = local_db0;
      local_570 = local_dc0;
      if (*(int *)(in_RDI + 0xe4) != 0) {
        if (*(int *)(local_e10 + 5) == 3) {
          local_8b0 = &local_12a8;
          local_37c = *(int *)((long)local_e10 + 0x2c);
          local_380 = *(int *)(local_e10 + 6);
          local_384 = *(undefined4 *)((long)local_e10 + 0x34);
          local_390 = (void *)((long)*local_e10 +
                              (long)local_e10[8] * (long)local_ff0 * (long)local_e10[2]);
          local_398 = local_e10[2];
          local_39c = *(undefined4 *)(local_e10 + 3);
          local_3a8 = (long *)local_e10[4];
          local_378 = &local_12a8;
          local_12a8 = local_390;
          local_12a0 = (int *)0x0;
          local_1298 = local_398;
          local_1290 = local_39c;
          local_1288 = local_3a8;
          local_127c = local_37c;
          local_1278 = local_380;
          local_1274 = 1;
          local_1270 = local_384;
          local_8 = (long)local_37c * (long)local_380 * (long)local_398;
          local_1268 = (void *)((local_8 + 0xfU & 0xfffffffffffffff0) / (ulong)local_398);
          local_1280 = *(int *)(local_e10 + 5) + -1;
          if (*(int *)(local_e10 + 5) == 4) {
            local_1268 = (void *)((long)*(int *)((long)local_e10 + 0x2c) *
                                 (long)*(int *)(local_e10 + 6));
          }
          local_c = 0x10;
          local_8b8 = local_e10;
          local_8bc = local_ff0;
          local_8bd = 1;
        }
        else {
          local_c70 = &local_12a8;
          local_c78 = local_e10;
          local_12a8 = *local_e10;
          local_12a0 = (int *)local_e10[1];
          local_1298 = local_e10[2];
          local_1290 = *(undefined4 *)(local_e10 + 3);
          local_1288 = (long *)local_e10[4];
          local_1280 = *(int *)(local_e10 + 5);
          local_127c = *(int *)((long)local_e10 + 0x2c);
          local_1278 = *(int *)(local_e10 + 6);
          local_1274 = *(undefined4 *)((long)local_e10 + 0x34);
          local_1270 = *(undefined4 *)(local_e10 + 7);
          local_1268 = local_e10[8];
          local_3c0 = local_c70;
          if (local_12a0 != (int *)0x0) {
            local_3c4 = 1;
            LOCK();
            local_3c8 = *local_12a0;
            *local_12a0 = *local_12a0 + 1;
            UNLOCK();
          }
        }
        local_1260 = &local_12a8;
        local_af0 = &local_12f0;
        local_af8 = &local_fa0;
        local_208 = (void *)((long)local_fa0 + local_f60 * local_ff0 * local_f90);
        local_1f0 = &local_12f0;
        local_78 = (long)local_f74 * (long)local_f70 * local_f90;
        for (local_12f4 = 0; local_12f4 < local_e5c; local_12f4 = local_12f4 + 1) {
          local_97c = local_12f4;
          local_1300 = (void *)((long)local_12a8 +
                               (long)local_127c * (long)local_12f4 * (long)local_1298);
          local_9ec = local_12f4;
          local_9e8 = &local_12f0;
          local_1308 = (void *)((long)local_208 + (long)local_f74 * (long)local_12f4 * local_f90);
          for (local_130c = 0; local_130c < local_e60; local_130c = local_130c + 1) {
            *(float *)((long)local_1308 + (long)local_130c * 4) =
                 *(float *)((long)local_1300 + (long)local_130c * 4) +
                 *(float *)((long)local_1308 + (long)local_130c * 4);
          }
          local_978 = local_1260;
        }
        local_d60 = &local_12f0;
        local_1160 = 0;
        local_1164 = 0;
        local_1168 = 0;
        local_116c = 0;
        local_1180 = 0;
        local_1188 = 0;
        local_1190 = 0;
        local_1198 = 0;
        local_12d0 = local_f80;
        local_7c = 0x10;
        local_1f4 = local_f74;
        local_1f8 = local_f70;
        local_1fc = local_f6c;
        local_210 = local_f90;
        local_214 = local_f88;
        local_220 = local_f80;
        local_afc = local_ff0;
        local_afd = 1;
        local_1158 = 0;
        local_1170 = 0;
        local_12f0 = 0;
        local_12e0 = 0;
        local_12d8 = 0;
        local_12c8 = 0;
        local_12c4 = 0;
        local_12c0 = 0;
        local_12bc = 0;
        local_12b8 = 0;
        local_12b0 = 0;
        local_12e8 = 0;
        local_d50 = &local_12a8;
        local_650 = local_d50;
        local_630 = local_d60;
        if (local_12a0 != (int *)0x0) {
          local_654 = 0xffffffff;
          LOCK();
          local_658 = *local_12a0;
          *local_12a0 = *local_12a0 + -1;
          UNLOCK();
          if (local_658 == 1) {
            if (local_1288 == (long *)0x0) {
              local_4f8 = local_12a8;
              if (local_12a8 != (void *)0x0) {
                free(local_12a8);
              }
            }
            else {
              (**(code **)(*local_1288 + 0x18))(local_1288,local_12a8);
            }
          }
        }
        local_12a8 = (void *)0x0;
        local_1298 = (void *)0x0;
        local_1290 = 0;
        local_1280 = 0;
        local_127c = 0;
        local_1278 = 0;
        local_1274 = 0;
        local_1270 = 0;
        local_1268 = (void *)0x0;
        local_12a0 = (int *)0x0;
      }
      local_b10 = &local_1358;
      local_b18 = &local_fa0;
      local_1d0 = (void *)((long)local_fa0 + local_f60 * local_ff0 * local_f90);
      local_1b8 = &local_1358;
      local_1350 = (int *)0x0;
      local_1348 = local_f90;
      local_1340 = local_f88;
      local_1338 = local_f80;
      local_132c = local_f74;
      local_1328 = local_f70;
      local_1324 = 1;
      local_1320 = local_f6c;
      local_88 = (long)local_f74 * (long)local_f70 * local_f90;
      local_1318 = (local_88 + 0xfU & 0xfffffffffffffff0) / local_f90;
      local_1330 = local_f78 + -1;
      if (local_f78 == 4) {
        local_1318 = (long)local_f74 * (long)local_f70;
      }
      local_8c = 0x10;
      local_1bc = local_f74;
      local_1c0 = local_f70;
      local_1c4 = local_f6c;
      local_1d8 = local_f90;
      local_1dc = local_f88;
      local_1e8 = local_f80;
      local_b1c = local_ff0;
      local_b1d = 1;
      local_1358 = local_1d0;
      for (local_135c = 0; local_135c < local_e5c; local_135c = local_135c + 1) {
        local_9f8 = &local_1358;
        local_9fc = local_135c;
        local_1368 = (void *)((long)local_1358 + (long)local_132c * (long)local_135c * local_1348);
        local_136c = -3.4028235e+38;
        for (local_1370 = 0; local_1370 < local_e60; local_1370 = local_1370 + 1) {
          pfVar2 = std::max<float>(&local_136c,(float *)((long)local_1368 + (long)local_1370 * 4));
          local_136c = *pfVar2;
        }
        local_1374 = 0.0;
        for (local_1378 = 0; local_1378 < local_e60; local_1378 = local_1378 + 1) {
          fVar3 = expf(*(float *)((long)local_1368 + (long)local_1378 * 4) - local_136c);
          *(float *)((long)local_1368 + (long)local_1378 * 4) = fVar3;
          local_1374 = *(float *)((long)local_1368 + (long)local_1378 * 4) + local_1374;
        }
        for (local_137c = 0; local_137c < local_e60; local_137c = local_137c + 1) {
          *(float *)((long)local_1368 + (long)local_137c * 4) =
               *(float *)((long)local_1368 + (long)local_137c * 4) / local_1374;
        }
      }
      local_d40 = &local_1358;
      local_670 = local_d40;
      if (local_1350 != (int *)0x0) {
        local_674 = 0xffffffff;
        LOCK();
        local_678 = *local_1350;
        *local_1350 = *local_1350 + -1;
        UNLOCK();
        if (local_678 == 1) {
          if (local_1338 == (long *)0x0) {
            local_4e8 = local_1358;
            if (local_1358 != (void *)0x0) {
              free(local_1358);
            }
          }
          else {
            (**(code **)(*local_1338 + 0x18))(local_1338,local_1358);
          }
        }
      }
      local_b30 = &local_13c8;
      local_b38 = &local_fa0;
      local_198 = (void *)((long)local_fa0 + local_f60 * local_ff0 * local_f90);
      local_180 = &local_13c8;
      local_98 = (long)local_f74 * (long)local_f70 * local_f90;
      local_b50 = &local_1410;
      local_b58 = &local_f58;
      local_160 = (void *)((long)local_f58 + local_f18 * local_ff0 * local_f48);
      local_148 = &local_1410;
      local_a8 = (long)local_f2c * (long)local_f28 * local_f48;
      for (local_1414 = 0; local_1414 < local_e5c; local_1414 = local_1414 + 1) {
        local_b70 = &local_1468;
        local_b78 = &local_fe8;
        local_128 = (void *)((long)local_fe8 + local_fa8 * local_1414 * local_fd8);
        local_110 = &local_1468;
        local_b8 = (long)local_fbc * (long)local_fb8 * local_fd8;
        local_1448 = local_fc8;
        local_bc = 0x10;
        local_114 = local_fbc;
        local_118 = local_fb8;
        local_11c = local_fb4;
        local_130 = local_fd8;
        local_134 = local_fd0;
        local_140 = local_fc8;
        local_b7c = local_1414;
        local_b7d = 1;
        local_a08 = &local_1468;
        local_a0c = local_ff0;
        local_1420 = (void *)((long)local_128 + (long)local_fbc * (long)local_ff0 * local_fd8);
        local_d30 = &local_1468;
        local_1468 = 0;
        local_1458 = 0;
        local_1450 = 0;
        local_1440 = 0;
        local_143c = 0;
        local_1438 = 0;
        local_1434 = 0;
        local_1430 = 0;
        local_1428 = 0;
        local_1460 = 0;
        for (local_146c = 0; local_146c < local_e64; local_146c = local_146c + 1) {
          local_98c = local_1414;
          local_988 = &local_13c8;
          local_99c = local_146c;
          local_998 = &local_1410;
          local_1484 = 0.0;
          local_1480 = (float *)((long)local_160 + (long)local_f2c * (long)local_146c * local_f48);
          local_1478 = (float *)((long)local_198 + (long)local_f74 * (long)local_1414 * local_f90);
          for (local_1488 = 0; local_1488 < local_e60; local_1488 = local_1488 + 1) {
            local_1484 = *local_1478 * *local_1480 + local_1484;
            local_1480 = local_1480 + 1;
            local_1478 = local_1478 + 1;
          }
          *(float *)((long)local_1420 + (long)local_146c * 4) = local_1484;
        }
        local_690 = local_d30;
      }
      local_d20 = &local_1410;
      local_1320 = 0;
      local_1324 = 0;
      local_1328 = 0;
      local_132c = 0;
      local_1340 = 0;
      local_1348 = 0;
      local_1350 = (int *)0x0;
      local_1358 = (void *)0x0;
      local_13a8 = local_f80;
      local_13f0 = local_f38;
      local_9c = 0x10;
      local_ac = 0x10;
      local_14c = local_f2c;
      local_150 = local_f28;
      local_154 = local_f24;
      local_168 = local_f48;
      local_16c = local_f40;
      local_178 = local_f38;
      local_184 = local_f74;
      local_188 = local_f70;
      local_18c = local_f6c;
      local_1a0 = local_f90;
      local_1a4 = local_f88;
      local_1b0 = local_f80;
      local_b3c = local_ff0;
      local_b3d = 1;
      local_b5c = local_ff0;
      local_b5d = 1;
      local_1318 = 0;
      local_1330 = 0;
      local_1410 = 0;
      local_1400 = 0;
      local_13f8 = 0;
      local_13e8 = 0;
      local_13e4 = 0;
      local_13e0 = 0;
      local_13dc = 0;
      local_13d8 = 0;
      local_13d0 = 0;
      local_1408 = 0;
      local_d10 = &local_13c8;
      local_13c8 = 0;
      local_13b8 = 0;
      local_13b0 = 0;
      local_13a0 = 0;
      local_139c = 0;
      local_1398 = 0;
      local_1394 = 0;
      local_1390 = 0;
      local_1388 = 0;
      local_13c0 = 0;
      local_6d0 = local_d10;
      local_6b0 = local_d20;
    }
    for (local_148c = 0; local_148c < local_e5c; local_148c = local_148c + 1) {
      local_a18 = local_e70;
      local_a1c = local_148c;
      local_1498 = (void *)((long)local_e70->data +
                           (long)local_e70->w * (long)local_148c * local_e70->elemsize);
      for (local_149c = 0; local_149c < *(int *)(in_RDI + 0xd0); local_149c = local_149c + 1) {
        local_b90 = &local_14f0;
        local_b98 = &local_fe8;
        local_f0 = (float *)((long)local_fe8 + local_fa8 * local_148c * local_fd8);
        local_d8 = &local_14f0;
        local_14d0 = local_fc8;
        local_c8 = (long)local_fbc * (long)local_fb8 * local_fd8;
        local_cc = 0x10;
        local_dc = local_fbc;
        local_e0 = local_fb8;
        local_e4 = local_fb4;
        local_f8 = local_fd8;
        local_fc = local_fd0;
        local_108 = local_fc8;
        local_b9c = local_148c;
        local_b9d = 1;
        local_8a0 = &local_14f0;
        local_d00 = &local_14f0;
        local_14f0 = 0;
        local_14e0 = 0;
        local_14d8 = 0;
        local_14c8 = 0;
        local_14c4 = 0;
        local_14c0 = 0;
        local_14bc = 0;
        local_14b8 = 0;
        local_14b0 = 0;
        local_14e8 = 0;
        local_920 = (long *)(in_RDI + 0x298);
        local_8f8 = (long *)(in_RDI + 0x2e0);
        local_900 = (long)local_149c;
        local_14fc = *(float *)(*local_8f8 + local_900 * 4);
        local_14f8 = (float *)(*local_920 + (long)(*(int *)(in_RDI + 0xd0) * local_149c) * 4);
        local_14a8 = local_f0;
        for (local_1500 = 0; local_1500 < *(int *)(in_RDI + 0xd0); local_1500 = local_1500 + 1) {
          local_14fc = *local_14a8 * *local_14f8 + local_14fc;
          local_14f8 = local_14f8 + 1;
          local_14a8 = local_14a8 + 1;
        }
        *(float *)((long)local_1498 + (long)local_149c * 4) = local_14fc;
        local_6f0 = local_d00;
      }
    }
    local_dcc = 0;
    local_e80 = 1;
    local_cf0 = &local_fe8;
    local_710 = local_cf0;
    if (local_fe0 != (int *)0x0) {
      local_714 = 0xffffffff;
      LOCK();
      local_718 = *local_fe0;
      *local_fe0 = *local_fe0 + -1;
      UNLOCK();
      if (local_718 == 1) {
        if (local_fc8 == (long *)0x0) {
          local_498 = local_fe8;
          if (local_fe8 != (void *)0x0) {
            free(local_fe8);
          }
        }
        else {
          (**(code **)(*local_fc8 + 0x18))(local_fc8,local_fe8);
        }
      }
    }
    local_fe8 = (void *)0x0;
    local_fd8 = 0;
    local_fd0 = 0;
    local_fc0 = 0;
    local_fbc = 0;
    local_fb8 = 0;
    local_fb4 = 0;
    local_fb0 = 0;
    local_fa8 = 0;
    local_fe0 = (int *)0x0;
    local_ce0 = &local_fa0;
    local_730 = local_ce0;
    if (local_f98 != (int *)0x0) {
      local_734 = 0xffffffff;
      LOCK();
      local_738 = *local_f98;
      *local_f98 = *local_f98 + -1;
      UNLOCK();
      if (local_738 == 1) {
        if (local_f80 == (long *)0x0) {
          local_488 = local_fa0;
          if (local_fa0 != (void *)0x0) {
            free(local_fa0);
          }
        }
        else {
          (**(code **)(*local_f80 + 0x18))(local_f80,local_fa0);
        }
      }
    }
    local_fa0 = (void *)0x0;
    local_f90 = 0;
    local_f88 = 0;
    local_f78 = 0;
    local_f74 = 0;
    local_f70 = 0;
    local_f6c = 0;
    local_f68 = 0;
    local_f60 = 0;
    local_f98 = (int *)0x0;
    local_cd0 = &local_f58;
    local_750 = local_cd0;
    if (local_f50 != (int *)0x0) {
      local_754 = 0xffffffff;
      LOCK();
      local_758 = *local_f50;
      *local_f50 = *local_f50 + -1;
      UNLOCK();
      if (local_758 == 1) {
        if (local_f38 == (long *)0x0) {
          local_478 = local_f58;
          if (local_f58 != (void *)0x0) {
            free(local_f58);
          }
        }
        else {
          (**(code **)(*local_f38 + 0x18))(local_f38,local_f58);
        }
      }
    }
    local_f58 = (void *)0x0;
    local_f48 = 0;
    local_f40 = 0;
    local_f30 = 0;
    local_f2c = 0;
    local_f28 = 0;
    local_f24 = 0;
    local_f20 = 0;
    local_f18 = 0;
    local_f50 = (int *)0x0;
    local_cc0 = &local_f10;
    local_770 = local_cc0;
    if (local_f08 != (int *)0x0) {
      local_774 = 0xffffffff;
      LOCK();
      local_778 = *local_f08;
      *local_f08 = *local_f08 + -1;
      UNLOCK();
      if (local_778 == 1) {
        if (local_ef0 == (long *)0x0) {
          local_468 = local_f10;
          if (local_f10 != (void *)0x0) {
            free(local_f10);
          }
        }
        else {
          (**(code **)(*local_ef0 + 0x18))(local_ef0,local_f10);
        }
      }
    }
    local_f10 = (void *)0x0;
    local_f00 = 0;
    local_ef8 = 0;
    local_ee8 = 0;
    local_ee4 = 0;
    local_ee0 = 0;
    local_edc = 0;
    local_ed8 = 0;
    local_ed0 = 0;
    local_f08 = (int *)0x0;
    ppvVar4 = &local_ec8;
    local_cb0 = ppvVar4;
    local_790 = ppvVar4;
    if (local_ec0 != (int *)0x0) {
      local_794 = 0xffffffff;
      LOCK();
      local_798 = *local_ec0;
      *local_ec0 = *local_ec0 + -1;
      UNLOCK();
      if (local_798 == 1) {
        if (local_ea8 == (long *)0x0) {
          local_458 = local_ec8;
          if (local_ec8 != (void *)0x0) {
            free(local_ec8);
          }
        }
        else {
          (**(code **)(*local_ea8 + 0x18))(local_ea8,local_ec8);
        }
      }
    }
    *ppvVar4 = (void *)0x0;
    ppvVar4[2] = (void *)0x0;
    *(undefined4 *)(ppvVar4 + 3) = 0;
    *(undefined4 *)(ppvVar4 + 5) = 0;
    *(undefined4 *)((long)ppvVar4 + 0x2c) = 0;
    *(undefined4 *)(ppvVar4 + 6) = 0;
    *(undefined4 *)((long)ppvVar4 + 0x34) = 0;
    *(undefined4 *)(ppvVar4 + 7) = 0;
    ppvVar4[8] = (void *)0x0;
    ppvVar4[1] = (void *)0x0;
  }
  local_ca0 = &local_e58;
  if (local_e50 != (int *)0x0) {
    local_7b4 = 0xffffffff;
    LOCK();
    local_7b8 = *local_e50;
    *local_e50 = *local_e50 + -1;
    UNLOCK();
    if (local_7b8 == 1) {
      local_7b0 = local_ca0;
      if (local_e38 == (Allocator *)0x0) {
        local_448 = local_e58;
        if (local_e58 != (void *)0x0) {
          free(local_e58);
        }
      }
      else {
        (*local_e38->_vptr_Allocator[3])(local_e38,local_e58);
      }
    }
  }
  return local_dcc;
}

Assistant:

int MultiHeadAttention::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& q_blob = bottom_blobs[0];
    const Mat& k_blob = (bottom_blobs.size() == 1 || (bottom_blobs.size() == 2 && attn_mask)) ? q_blob : bottom_blobs[1];
    const Mat& v_blob = (bottom_blobs.size() == 1 || (bottom_blobs.size() == 2 && attn_mask)) ? q_blob : (bottom_blobs.size() == 2 || (bottom_blobs.size() == 3 && attn_mask)) ? k_blob : bottom_blobs[2];
    const Mat& attn_mask_blob = attn_mask ? bottom_blobs[bottom_blobs.size() - 1] : Mat();

    const int src_seqlen = q_blob.h;
    const int dst_seqlen = k_blob.h;
    const int embed_dim_per_head = embed_dim / num_heads;

    // assert k_blob.h == v_blob.h

    Mat& top_blob = top_blobs[0];
    top_blob.create(embed_dim, src_seqlen, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -1;

    Mat xq(embed_dim_per_head, src_seqlen, num_heads, 4u, opt.workspace_allocator);
    Mat xk(embed_dim_per_head, dst_seqlen, num_heads, 4u, opt.workspace_allocator);
    Mat xv(dst_seqlen, embed_dim_per_head, num_heads, 4u, opt.workspace_allocator);

    Mat xqk(dst_seqlen, src_seqlen, num_heads, 4u, opt.workspace_allocator);

    Mat xqkv(embed_dim_per_head, num_heads, src_seqlen, 4u, opt.workspace_allocator);

    const float inv_sqrt_embed_dim_per_head = 1.f / sqrtf(embed_dim_per_head);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < num_heads; q++)
    {
        // xq = affine(q) * inv_sqrt_embed_dim_per_head
        {
            Mat outm = xq.channel(q);

            for (int i = 0; i < src_seqlen; i++)
            {
                float* outptr = outm.row(i);

                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const float* ptr = q_blob.row(i);
                    const float* kptr = (const float*)q_weight_data + embed_dim * (q * embed_dim_per_head + j);

                    float sum = q_bias_data[q * embed_dim_per_head + j];
                    for (int k = 0; k < embed_dim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }

                    outptr[j] = sum * inv_sqrt_embed_dim_per_head;
                }
            }
        }

        // xk = affine(k)
        {
            Mat outm = xk.channel(q);

            for (int i = 0; i < dst_seqlen; i++)
            {
                float* outptr = outm.row(i);

                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const float* ptr = k_blob.row(i);
                    const float* kptr = (const float*)k_weight_data + kdim * (q * embed_dim_per_head + j);

                    float sum = k_bias_data[q * embed_dim_per_head + j];
                    for (int k = 0; k < kdim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }

                    outptr[j] = sum;
                }
            }
        }

        // xv = affine(v)
        {
            Mat outm = xv.channel(q);

            for (int i = 0; i < embed_dim_per_head; i++)
            {
                for (int j = 0; j < dst_seqlen; j++)
                {
                    const float* ptr = v_blob.row(j);
                    const float* kptr = (const float*)v_weight_data + vdim * (q * embed_dim_per_head + i);

                    float sum = v_bias_data[q * embed_dim_per_head + i];
                    for (int k = 0; k < vdim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }

                    float* outptr = outm.row(i);

                    outptr[j] = sum;
                }
            }
        }

        // xqk = xq * xk
        // xq  (embed_dim_per_head, src_seqlen)
        // xk  (embed_dim_per_head, dst_seqlen)
        {
            const Mat xqm = xq.channel(q);
            const Mat xkm = xk.channel(q);

            Mat outm = xqk.channel(q);

            for (int i = 0; i < src_seqlen; i++)
            {
                float* outptr = outm.row(i);

                for (int j = 0; j < dst_seqlen; j++)
                {
                    const float* qptr = xqm.row(i);
                    const float* kptr = xkm.row(j);

                    float sum = 0.f;
                    for (int k = 0; k < embed_dim_per_head; k++)
                    {
                        sum += *qptr++ * *kptr++;
                    }

                    outptr[j] = sum;
                }
            }
        }

        // xqk = xqk + mask
        if (attn_mask)
        {
            const Mat& maskm = attn_mask_blob.dims == 3 ? attn_mask_blob.channel(q) : attn_mask_blob;
            Mat outm = xqk.channel(q);

            for (int i = 0; i < src_seqlen; i++)
            {
                const float* mptr = maskm.row(i);
                float* outptr = outm.row(i);

                for (int j = 0; j < dst_seqlen; j++)
                {
                    outptr[j] += mptr[j];
                }
            }
        }

        // softmax(xqk)
        {
            Mat outm = xqk.channel(q);

            for (int i = 0; i < src_seqlen; i++)
            {
                float* ptr = outm.row(i);

                float max = -FLT_MAX;
                for (int j = 0; j < dst_seqlen; j++)
                {
                    max = std::max(max, ptr[j]);
                }

                float sum = 0.f;
                for (int j = 0; j < dst_seqlen; j++)
                {
                    ptr[j] = (float)(expf(ptr[j] - max));
                    sum += ptr[j];
                }

                for (int j = 0; j < dst_seqlen; j++)
                {
                    ptr[j] /= sum;
                }
            }
        }

        // xqkv = xqk * xv
        // xqk (dst_seqlen, src_seqlen)
        // xv  (dst_seqlen, embed_dim_per_head)
        // out (embed_dim_per_head, num_heads, src_seqlen)
        {
            const Mat xqkm = xqk.channel(q);
            const Mat xvm = xv.channel(q);

            for (int i = 0; i < src_seqlen; i++)
            {
                float* outptr = xqkv.channel(i).row(q);

                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const float* qkptr = xqkm.row(i);
                    const float* vptr = xvm.row(j);

                    float sum = 0.f;
                    for (int k = 0; k < dst_seqlen; k++)
                    {
                        sum += *qkptr++ * *vptr++;
                    }

                    outptr[j] = sum;
                }
            }
        }
    }

    // out = affine(xqkv)
    // xqkv  (embed_dim, src_seqlen)
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < src_seqlen; i++)
    {
        float* outptr = top_blob.row(i);

        for (int j = 0; j < embed_dim; j++)
        {
            const float* ptr = xqkv.channel(i);
            const float* kptr = (const float*)out_weight_data + embed_dim * j;

            float sum = out_bias_data[j];
            for (int k = 0; k < embed_dim; k++)
            {
                sum += *ptr++ * *kptr++;
            }

            outptr[j] = sum;
        }
    }

    return 0;
}